

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall httplib::Server::set_base_dir(Server *this,char *dir,char *mount_point)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  stat st;
  allocator<char> local_e1;
  char *local_e0;
  long *local_d8 [2];
  long local_c8 [2];
  undefined1 local_b8 [144];
  
  local_e0 = dir;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,dir,&local_e1);
  iVar2 = stat((char *)local_d8[0],(stat *)local_b8);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  if ((local_b8._24_4_ & 0xf000) == 0x4000 && -1 < iVar2) {
    __s = "/";
    if (mount_point != (char *)0x0) {
      __s = mount_point;
    }
    local_b8._0_8_ = local_b8 + 0x10;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,__s,__s + sVar3);
    bVar1 = true;
    if ((local_b8._8_8_ != 0) && (*(char *)local_b8._0_8_ == '/')) {
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::__cxx11::string&,char_const*&>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&this->base_dirs_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 &local_e0);
      bVar1 = false;
    }
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    if (!bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

inline bool Server::set_base_dir(const char *dir, const char *mount_point) {
  if (detail::is_dir(dir)) {
    std::string mnt = mount_point ? mount_point : "/";
    if (!mnt.empty() && mnt[0] == '/') {
      base_dirs_.emplace_back(mnt, dir);
      return true;
    }
  }
  return false;
}